

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O0

BmsBuffer * __thiscall BmsBuffer::ToString_abi_cxx11_(BmsBuffer *this)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  _Self *p_Var5;
  BmsBuffer *in_RSI;
  undefined1 local_5c [12];
  uint i;
  _Rb_tree_const_iterator<std::pair<const_int,_BmsWord>_> local_48;
  _Self local_40;
  _Self it;
  barindex local_30;
  uint step;
  allocator local_19 [9];
  BmsBuffer *this_local;
  string *tmp;
  
  this_local = this;
  uVar3 = GetObjectCount(in_RSI);
  if (uVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  else {
    it._M_node = (_Base_ptr)Begin(in_RSI);
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_int,_BmsWord>_>::operator->(&it);
    local_30 = ppVar4->first;
    local_48._M_node = (_Base_ptr)Begin(in_RSI);
    p_Var5 = std::_Rb_tree_const_iterator<std::pair<const_int,_BmsWord>_>::operator++(&local_48);
    local_40._M_node = p_Var5->_M_node;
    while( true ) {
      _i = End(in_RSI);
      bVar2 = std::operator!=(&local_40,(_Self *)&i);
      if (!bVar2) break;
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_int,_BmsWord>_>::operator->(&local_40);
      local_30 = BmsUtil::GCD(local_30,ppVar4->first);
      std::_Rb_tree_const_iterator<std::pair<const_int,_BmsWord>_>::operator++(&local_40);
    }
    local_5c[0xb] = 0;
    std::__cxx11::string::string((string *)this);
    GetObjectCount(in_RSI);
    std::__cxx11::string::reserve((ulong)this);
    for (local_5c._4_4_ = 0; uVar1 = local_5c._4_4_, uVar3 = GetObjectCount(in_RSI),
        (uint)uVar1 < uVar3; local_5c._4_4_ = local_30 + local_5c._4_4_) {
      Get((BmsBuffer *)local_5c,(barindex)in_RSI);
      BmsWord::ToCharPtr((BmsWord *)local_5c);
      std::__cxx11::string::append((char *)this);
      BmsWord::~BmsWord((BmsWord *)local_5c);
    }
  }
  return this;
}

Assistant:

std::string
BmsBuffer::ToString(void) const
{
	if (this->GetObjectCount() == 0) {
		return "";
	}

	// calculate GCD (minimize output string)
	unsigned int step = Begin()->first;
	for (auto it = ++Begin(); it != End(); ++it) {
		step = BmsUtil::GCD(step, it->first);
	}

	std::string tmp;
	tmp.reserve(this->GetObjectCount() / step * 2);
	for (unsigned int i = 0; i < this->GetObjectCount(); i += step) {
		tmp.append(Get(i).ToCharPtr());
	}
	return tmp;
}